

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printAddrMode6OffsetOperand(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  uint uVar3;
  cs_struct *h;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  MCOperand *MO;
  char *in_stack_ffffffffffffffc8;
  SStream *in_stack_ffffffffffffffd0;
  
  h = (cs_struct *)MCInst_getOperand(in_RDI,in_ESI);
  uVar3 = MCOperand_getReg((MCOperand *)h);
  if (uVar3 == 0) {
    in_RDI->writeback = true;
    SStream_concat0(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  else {
    SStream_concat0(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    uVar3 = (uint)((ulong)in_RDI->csh >> 0x20);
    MCOperand_getReg((MCOperand *)h);
    printRegName(h,in_RDX,uVar3);
    if (in_RDI->csh->detail != CS_OPT_OFF) {
      puVar1 = in_RDI->flat_insn->detail->groups +
               (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x41;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      uVar3 = MCOperand_getReg((MCOperand *)h);
      *(uint *)(in_RDI->flat_insn->detail->groups +
               (ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x45) = uVar3;
      in_RDI->flat_insn->detail->groups
      [(ulong)(in_RDI->flat_insn->detail->field_6).arm.op_count * 0x30 + 0x5e] = '\x01';
      pcVar2 = in_RDI->flat_insn->detail;
      (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
    }
  }
  return;
}

Assistant:

static void printAddrMode6OffsetOperand(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *MO = MCInst_getOperand(MI, OpNum);
	if (MCOperand_getReg(MO) == 0) {
		MI->writeback = true;
		SStream_concat0(O, "!");
	} else {
		SStream_concat0(O, ", ");
		printRegName(MI->csh, O, MCOperand_getReg(MO));
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MO);
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].access = CS_AC_READ;
			MI->flat_insn->detail->arm.op_count++;
		}
	}
}